

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> *
CoreML::defaultShapeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ArrayFeatureType *params)

{
  uint uVar1;
  iterator iVar2;
  uint32 uVar3;
  long *plVar4;
  ArrayFeatureType_EnumeratedShapes *extraout_RAX;
  ArrayFeatureType_EnumeratedShapes *pAVar5;
  Type *pTVar6;
  LogMessage *pLVar7;
  int i;
  int iVar8;
  LogFinisher local_71;
  long local_70;
  LogMessage local_68;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((params->shape_).current_size_ < 1) {
    uVar1 = params->_oneof_case_[0];
    pAVar5 = (ArrayFeatureType_EnumeratedShapes *)(ulong)uVar1;
    if (uVar1 == 0x15) {
      iVar8 = 0;
      uVar3 = 0x15;
      while( true ) {
        if (uVar3 == 0x15) {
          pAVar5 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar5 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        if ((pAVar5->shapes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             (&local_68,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage(&local_68);
        }
        pAVar5 = (ArrayFeatureType_EnumeratedShapes *)
                 ((pAVar5->shapes_).super_RepeatedPtrFieldBase.rep_)->elements[0];
        if (*(int *)&(((RepeatedPtrField<CoreML::Specification::SizeRange> *)&pAVar5->shapes_)->
                     super_RepeatedPtrFieldBase).arena_ <= iVar8) break;
        if (params->_oneof_case_[0] == 0x15) {
          pAVar5 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar5 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        if ((pAVar5->shapes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             (&local_68,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=(&local_71,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage(&local_68);
        }
        plVar4 = google::protobuf::RepeatedField<long>::Get
                           ((RepeatedField<long> *)
                            ((long)((pAVar5->shapes_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                            + 0x10),iVar8);
        local_70 = *plVar4;
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (__return_storage_ptr__,iVar2,&local_70);
        }
        else {
          *iVar2._M_current = local_70;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar8 = iVar8 + 1;
        uVar3 = params->_oneof_case_[0];
      }
    }
    else if (uVar1 == 0x1f) {
      iVar8 = 0;
      uVar3 = 0x1f;
      while( true ) {
        if (uVar3 == 0x1f) {
          pAVar5 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar5 = (ArrayFeatureType_EnumeratedShapes *)
                   Specification::ArrayFeatureType_ShapeRange::default_instance();
        }
        if ((((RepeatedPtrField<CoreML::Specification::SizeRange> *)&pAVar5->shapes_)->
            super_RepeatedPtrFieldBase).current_size_ <= iVar8) break;
        if (params->_oneof_case_[0] == 0x1f) {
          pAVar5 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar5 = (ArrayFeatureType_EnumeratedShapes *)
                   Specification::ArrayFeatureType_ShapeRange::default_instance();
        }
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                           ((RepeatedPtrFieldBase *)&pAVar5->shapes_,iVar8);
        local_68._0_8_ = pTVar6->lowerbound_;
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (__return_storage_ptr__,iVar2,(long *)&local_68);
        }
        else {
          *iVar2._M_current = local_68._0_8_;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar8 = iVar8 + 1;
        uVar3 = params->_oneof_case_[0];
      }
    }
  }
  else {
    iVar8 = 0;
    do {
      plVar4 = google::protobuf::RepeatedField<long>::Get(&params->shape_,iVar8);
      pAVar5 = (ArrayFeatureType_EnumeratedShapes *)*plVar4;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_68._0_8_ = pAVar5;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar2,(long *)&local_68);
        pAVar5 = extraout_RAX;
      }
      else {
        *iVar2._M_current = (long)pAVar5;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < (params->shape_).current_size_);
  }
  return (vector<long,_std::allocator<long>_> *)pAVar5;
}

Assistant:

static std::vector<int64_t> defaultShapeOf(const Specification::ArrayFeatureType &params) {
        std::vector<int64_t> defaultShape;
        if (params.shape_size() > 0) {
            for (int i = 0; i<params.shape_size(); i++) {
                defaultShape.push_back((int64_t)params.shape(i));
            }
            return defaultShape;
        }

        switch (params.ShapeFlexibility_case()) {
            case Specification::ArrayFeatureType::kEnumeratedShapes: {
                for (int i = 0; i < params.enumeratedshapes().shapes(0).shape_size(); i++) {
                    defaultShape.push_back((int64_t)params.enumeratedshapes().shapes(0).shape(i));
                }
                break;
            }
            case Specification::ArrayFeatureType::kShapeRange: {
                for (int i=0; i < params.shaperange().sizeranges_size(); i++) {
                    defaultShape.push_back((int64_t)params.shaperange().sizeranges(i).lowerbound());
                }
                break;
            }
            case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                break;
        }

        return defaultShape;
    }